

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_filling_magic_number.cc
# Opt level: O2

int __thiscall sptk::InputSourceFillingMagicNumber::Proceed(InputSourceFillingMagicNumber *this)

{
  _Map_pointer ppvVar1;
  double *pdVar2;
  _Elt_pointer pvVar3;
  pointer pdVar4;
  _Elt_pointer pvVar5;
  _Map_pointer ppvVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  size_type sVar10;
  _Elt_pointer pvVar11;
  pointer piVar12;
  long lVar13;
  int j;
  ulong uVar14;
  long lVar15;
  _Elt_pointer pvVar16;
  _Map_pointer ppvVar17;
  _Elt_pointer pvVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
  local_98;
  vector<double,_std::allocator<double>_> curr_data;
  reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
  local_58;
  
  pvVar11 = (this->queue_).
            super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->queue_).
      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pvVar11) goto LAB_00104aa3;
  pdVar9 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)pdVar2 - (long)pdVar9;
  dVar20 = this->magic_number_;
  for (lVar15 = lVar13 >> 5; 0 < lVar15; lVar15 = lVar15 + -1) {
    if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) goto LAB_00104a9a;
    if ((dVar20 == pdVar9[1]) && (!NAN(dVar20) && !NAN(pdVar9[1]))) {
      pdVar9 = pdVar9 + 1;
      goto LAB_00104a9a;
    }
    if ((dVar20 == pdVar9[2]) && (!NAN(dVar20) && !NAN(pdVar9[2]))) {
      pdVar9 = pdVar9 + 2;
      goto LAB_00104a9a;
    }
    if ((dVar20 == pdVar9[3]) && (!NAN(dVar20) && !NAN(pdVar9[3]))) {
      pdVar9 = pdVar9 + 3;
      goto LAB_00104a9a;
    }
    pdVar9 = pdVar9 + 4;
    lVar13 = lVar13 + -0x20;
  }
  lVar13 = lVar13 >> 3;
  if (lVar13 == 1) {
LAB_00104a79:
    if (dVar20 != *pdVar9) {
      return 2;
    }
    if (NAN(dVar20) || NAN(*pdVar9)) {
      return 2;
    }
  }
  else if (lVar13 == 2) {
LAB_00104a6d:
    if ((dVar20 != *pdVar9) || (NAN(dVar20) || NAN(*pdVar9))) {
      pdVar9 = pdVar9 + 1;
      goto LAB_00104a79;
    }
  }
  else {
    if (lVar13 != 3) {
      return 2;
    }
    if ((dVar20 != *pdVar9) || (NAN(dVar20) || NAN(*pdVar9))) {
      pdVar9 = pdVar9 + 1;
      goto LAB_00104a6d;
    }
  }
LAB_00104a9a:
  if (pdVar9 == pdVar2) {
    return 2;
  }
LAB_00104aa3:
  uVar7 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
  curr_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  curr_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  curr_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar8 = (*this->source_->_vptr_InputSourceInterface[4])();
  if ((char)iVar8 == '\0') {
    pvVar11 = (this->queue_).
              super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pvVar3 = (this->queue_).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar3 == pvVar11) {
      iVar8 = 0;
    }
    else {
      pdVar4 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar5 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppvVar6 = (this->queue_).
                super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      uVar19 = 0;
      uVar14 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar14 = uVar19;
      }
      iVar8 = 2;
      for (; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        dVar20 = this->magic_number_;
        pdVar9 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar19;
        if ((dVar20 == *pdVar9) && (!NAN(dVar20) && !NAN(*pdVar9))) {
          dVar21 = pdVar4[uVar19];
          pvVar16 = pvVar11;
          ppvVar17 = ppvVar6;
          pvVar18 = pvVar5;
          if ((dVar20 == dVar21) && (!NAN(dVar20) && !NAN(dVar21))) {
            iVar8 = 1;
            break;
          }
          while (pvVar16 != pvVar3) {
            (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar19] = dVar21;
            pvVar16 = pvVar16 + 1;
            if (pvVar16 == pvVar18) {
              ppvVar1 = ppvVar17 + 1;
              pvVar16 = *ppvVar1;
              ppvVar17 = ppvVar17 + 1;
              pvVar18 = *ppvVar1 + 0x15;
            }
          }
        }
      }
    }
  }
  else {
    uVar19 = 0;
    uVar14 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar14 = uVar19;
    }
    for (; uVar19 != uVar14; uVar19 = uVar19 + 1) {
      dVar20 = curr_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      piVar12 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar8 = piVar12[uVar19];
      if ((this->magic_number_ != dVar20) || (NAN(this->magic_number_) || NAN(dVar20))) {
        if (iVar8 != 0) {
          sVar10 = std::
                   deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::size(&this->queue_);
          piVar12 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (piVar12[uVar19] == (int)sVar10) {
            dVar21 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19];
            if ((this->magic_number_ == dVar21) && (!NAN(this->magic_number_) && !NAN(dVar21))) {
              dVar21 = dVar20;
            }
          }
          else {
            local_58.current._M_cur =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_58.current._M_first =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_58.current._M_last =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_58.current._M_node =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
            std::
            reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
            ::operator+(&local_98,&local_58,(long)piVar12[uVar19]);
            pvVar11 = local_98.current._M_cur;
            if (local_98.current._M_cur == local_98.current._M_first) {
              pvVar11 = local_98.current._M_node[-1] + 0x15;
            }
            dVar21 = pvVar11[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19];
            piVar12 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            sVar10 = (size_type)(uint)piVar12[uVar19];
          }
          dVar21 = dVar21 - dVar20;
          iVar8 = (int)sVar10;
          for (lVar13 = 0; lVar13 < (int)sVar10; lVar13 = lVar13 + 1) {
            local_58.current._M_cur =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_58.current._M_first =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_58.current._M_last =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_58.current._M_node =
                 (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
            std::
            reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
            ::operator+(&local_98,&local_58,lVar13);
            pvVar11 = local_98.current._M_cur;
            if (local_98.current._M_cur == local_98.current._M_first) {
              pvVar11 = local_98.current._M_node[-1] + 0x15;
            }
            dVar20 = dVar20 + dVar21 / (double)(iVar8 + 1);
            pvVar11[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = dVar20;
            piVar12 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            sVar10 = (size_type)(uint)piVar12[uVar19];
          }
          piVar12[uVar19] = 0;
        }
      }
      else {
        piVar12[uVar19] = iVar8 + 1;
      }
    }
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->queue_,&curr_data);
    iVar8 = 3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&curr_data.super__Vector_base<double,_std::allocator<double>_>);
  return iVar8;
}

Assistant:

int InputSourceFillingMagicNumber::Proceed() {
  // If magic number is not in the front of queue, you can output the data.
  if (!queue_.empty()) {
    if (std::find_if(queue_.front().begin(), queue_.front().end(),
                     [this](double x) { return magic_number_ == x; }) ==
        queue_.front().end()) {
      return kGood;
    }
  }

  const int data_size(GetSize());

  // Load new data.
  std::vector<double> curr_data;
  if (!source_->Get(&curr_data)) {
    if (queue_.empty()) {
      return kExit;
    }
    for (int i(0); i < data_size; ++i) {
      if (magic_number_ == queue_.front()[i]) {
        if (magic_number_ == final_output_[i]) {
          // This means all the data is magic number.
          return kFail;
        }
        // Replace magic number with final output value.
        for (std::deque<std::vector<double> >::iterator itr(queue_.begin());
             itr != queue_.end(); ++itr) {
          (*itr)[i] = final_output_[i];
        }
      }
    }
    return kGood;
  }

  for (int i(0); i < data_size; ++i) {
    const double right(curr_data[i]);

    if (magic_number_ == right) {
      ++magic_number_region_[i];
    } else if (magic_number_region_[i]) {
      // Interpolate magic numbers.
      double left;
      if (static_cast<int>(queue_.size()) != magic_number_region_[i]) {
        left = (*(queue_.rbegin() + magic_number_region_[i]))[i];
      } else if (magic_number_ != final_output_[i]) {
        left = final_output_[i];
      } else {
        left = right;
      }
      const double slope((left - right) / (magic_number_region_[i] + 1));
      double value(right);
      for (int j(0); j < magic_number_region_[i]; ++j) {
        value += slope;
        (*(queue_.rbegin() + j))[i] = value;
      }
      magic_number_region_[i] = 0;
    }
  }
  queue_.push_back(curr_data);

  return kWait;
}